

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

_Bool str_matches_any(char *haystack,char **needles,int num_needles)

{
  int iVar1;
  ulong uVar2;
  _Bool _Var3;
  bool bVar4;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x260,"_Bool str_matches_any(const char *, const char **, int)");
  }
  if (needles == (char **)0x0) {
    __assert_fail("needles != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x261,"_Bool str_matches_any(const char *, const char **, int)");
  }
  _Var3 = num_needles != 0;
  if (num_needles < 0) {
    __assert_fail("num_needles >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x262,"_Bool str_matches_any(const char *, const char **, int)");
  }
  if (_Var3) {
    uVar2 = 1;
    do {
      if (needles[uVar2 - 1] == (char *)0x0) {
        __assert_fail("needles[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                      ,0x265,"_Bool str_matches_any(const char *, const char **, int)");
      }
      iVar1 = strcmp(haystack,needles[uVar2 - 1]);
      if (iVar1 == 0) {
        return _Var3;
      }
      _Var3 = uVar2 < (uint)num_needles;
      bVar4 = uVar2 != (uint)num_needles;
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  return _Var3;
}

Assistant:

bool str_matches_any(const char *haystack, const char **needles, int num_needles)
{
    assert(haystack != NULL);
    assert(needles != NULL);
    assert(num_needles >= 0);

    for (int i = 0; i < num_needles; i++) {
        assert(needles[i] != NULL);
        if (!strcmp(haystack, needles[i]))
            return true;
    }

    return false;
}